

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticSeverity.cpp
# Opt level: O1

ostream * psy::operator<<(ostream *os,DiagnosticSeverity severity)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000031,severity);
  if (iVar3 == 2) {
    pcVar4 = "error";
    lVar2 = 5;
  }
  else {
    if (iVar3 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/common/diagnostics/DiagnosticSeverity.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x26);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      return os;
    }
    pcVar4 = "warning";
    lVar2 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, DiagnosticSeverity severity)
{
    switch (severity)
    {
        case DiagnosticSeverity::Warning:
            os << "warning";
            break;
        case DiagnosticSeverity::Error:
            os << "error";
            break;
        default:
            PSY_ASSERT_FAIL_1(return os);
    }
    return os;
}